

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O1

int uv_tcp_close_reset(uv_tcp_t *handle,uv_close_cb close_cb)

{
  int iVar1;
  int *piVar2;
  linger l;
  undefined8 local_18;
  
  local_18 = 1;
  iVar1 = -0x16;
  if ((handle->flags & 0x100) == 0) {
    iVar1 = setsockopt((handle->io_watcher).fd,1,0xd,&local_18,8);
    if (iVar1 != 0) {
      piVar2 = __errno_location();
      if (*piVar2 != 0x16) {
        return -*piVar2;
      }
      *piVar2 = 0;
    }
    uv_close((uv_handle_t *)handle,close_cb);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int uv_tcp_close_reset(uv_tcp_t* handle, uv_close_cb close_cb) {
  int fd;
  struct linger l = { 1, 0 };

  /* Disallow setting SO_LINGER to zero due to some platform inconsistencies */
  if (handle->flags & UV_HANDLE_SHUTTING)
    return UV_EINVAL;

  fd = uv__stream_fd(handle);
  if (0 != setsockopt(fd, SOL_SOCKET, SO_LINGER, &l, sizeof(l))) {
    if (errno == EINVAL) {
      /* Open Group Specifications Issue 7, 2018 edition states that
       * EINVAL may mean the socket has been shut down already.
       * Behavior observed on Solaris, illumos and macOS. */
      errno = 0;
    } else {
      return UV__ERR(errno);
    }
  }

  uv_close((uv_handle_t*) handle, close_cb);
  return 0;
}